

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestUint64Conversions(void)

{
  char *in_RCX;
  
  CheckEqualsHelper((char *)0x2b,0xc1c075,"Double(ordered).value()",3.512700564088504e-303,in_RCX,
                    3.512700564088504e-303);
  CheckEqualsHelper((char *)0x2e,0xc1c0a3,"Double(min_double64).value()",4.94065645841247e-324,
                    in_RCX,4.94065645841247e-324);
  CheckEqualsHelper((char *)0x31,0xc1d0ae,"Double(max_double64).value()",1.79769313486232e+308,
                    in_RCX,1.79769313486232e+308);
  return;
}

Assistant:

TEST(Uint64Conversions) {
  // Start by checking the byte-order.
  uint64_t ordered = DOUBLE_CONVERSION_UINT64_2PART_C(0x01234567, 89ABCDEF);
  CHECK_EQ(3512700564088504e-318, Double(ordered).value());

  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  CHECK_EQ(5e-324, Double(min_double64).value());

  uint64_t max_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x7fefffff, ffffffff);
  CHECK_EQ(1.7976931348623157e308, Double(max_double64).value());
}